

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

mg_connection *
mg_connect_websocket_client_secure
          (mg_client_options *client_options,char *error_buffer,size_t error_buffer_size,char *path,
          char *origin,mg_websocket_data_handler data_func,mg_websocket_close_handler close_func,
          void *user_data)

{
  mg_websocket_data_handler data_func_local;
  char *origin_local;
  char *path_local;
  size_t error_buffer_size_local;
  char *error_buffer_local;
  mg_client_options *client_options_local;
  
  if (client_options == (mg_client_options *)0x0) {
    client_options_local = (mg_client_options *)0x0;
  }
  else {
    client_options_local =
         (mg_client_options *)
         mg_connect_websocket_client_impl
                   (client_options,1,error_buffer,error_buffer_size,path,origin,(char *)0x0,
                    data_func,close_func,user_data);
  }
  return (mg_connection *)client_options_local;
}

Assistant:

mg_connection *
mg_connect_websocket_client_secure(
    const struct mg_client_options *client_options,
    char *error_buffer,
    size_t error_buffer_size,
    const char *path,
    const char *origin,
    mg_websocket_data_handler data_func,
    mg_websocket_close_handler close_func,
    void *user_data)
{
	if (!client_options) {
		return NULL;
	}
	return mg_connect_websocket_client_impl(client_options,
	                                        1,
	                                        error_buffer,
	                                        error_buffer_size,
	                                        path,
	                                        origin,
	                                        NULL,
	                                        data_func,
	                                        close_func,
	                                        user_data);
}